

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

string * wabt::anon_unknown_0::GetMemoryAPIString
                   (string *__return_storage_ptr__,Memory *memory,string *api)

{
  bool bVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string suffix;
  string *api_local;
  Memory *memory_local;
  
  suffix.field_2._8_8_ = api;
  std::__cxx11::string::string((string *)local_40);
  if (((memory->page_limits).is_shared & 1U) != 0) {
    std::__cxx11::string::operator+=((string *)local_40,"_shared");
  }
  std::__cxx11::string::substr((ulong)&local_60,(ulong)api);
  bVar1 = std::operator!=(&local_60,"wasm_rt_");
  bVar2 = false;
  if ((bVar1) && (bVar2 = false, memory->page_size == 0x10000)) {
    bVar2 = ((memory->page_limits).is_64 & 1U) == 0;
  }
  std::__cxx11::string::~string((string *)&local_60);
  if (bVar2) {
    std::__cxx11::string::operator+=((string *)local_40,"_default32");
  }
  std::operator+(__return_storage_ptr__,api,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

static std::string GetMemoryAPIString(const Memory& memory, std::string api) {
  std::string suffix;
  if (memory.page_limits.is_shared) {
    suffix += "_shared";
  }

  // Memory load and store routines can be optimized for default-page-size,
  // 32-bit memories (by using hardware to bounds-check memory access).
  // Append "_default32" to these function names to choose the (possibly) fast
  // path.
  //
  // We don't need to do this for runtime routines; those can check the
  // wasm_rt_memory_t structure.
  if (api.substr(0, 8) != "wasm_rt_" &&
      memory.page_size == WABT_DEFAULT_PAGE_SIZE &&
      memory.page_limits.is_64 == false) {
    suffix += "_default32";
  }
  return api + suffix;
}